

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

int tcu::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ChannelType channelType;
  ChannelType channelType_00;
  int iVar4;
  int iVar5;
  TextureChannelClass TVar6;
  TextureChannelClass TVar7;
  int extraout_EAX;
  void *pvVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint x;
  uint uVar12;
  uint uVar13;
  float depth;
  
  uVar1 = *(uint *)(dst + 8);
  uVar2 = *(uint *)(dst + 0xc);
  iVar3 = *(int *)(dst + 0x10);
  iVar4 = TextureFormat::getPixelSize((TextureFormat *)src);
  iVar5 = TextureFormat::getPixelSize((TextureFormat *)dst);
  iVar9 = *(int *)src;
  channelType = *(ChannelType *)(src + 4);
  iVar10 = *(int *)dst;
  channelType_00 = *(ChannelType *)(dst + 4);
  uVar11 = uVar1;
  if (((iVar4 != *(int *)(src + 0x14)) || (iVar5 != *(int *)(dst + 0x14))) ||
     (channelType != channelType_00 || iVar9 != iVar10)) {
    if (channelType != channelType_00 || iVar9 != iVar10) {
      if (iVar9 - 0x12U < 3 || iVar10 - 0x12U < 3) {
        uVar13 = iVar10 - 0x13;
        if ((iVar9 - 0x12U & 0xfffffffd) == 0 && (iVar10 - 0x12U & 0xfffffffd) == 0) {
          if (0 < iVar3) {
            iVar10 = 0;
            do {
              if (0 < (int)uVar2) {
                uVar12 = 0;
                do {
                  if (0 < (int)uVar1) {
                    x = 0;
                    do {
                      depth = ConstPixelBufferAccess::getPixDepth
                                        ((ConstPixelBufferAccess *)src,x,uVar12,iVar10);
                      PixelBufferAccess::setPixDepth((PixelBufferAccess *)dst,depth,x,uVar12,iVar10)
                      ;
                      x = x + 1;
                    } while (uVar1 != x);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar2);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != iVar3);
          }
        }
        else if (((iVar10 == 0x14) || (iVar10 == 0x12)) && ((iVar9 != 0x12 && (iVar9 != 0x14)))) {
          clearDepth((PixelBufferAccess *)dst,0.0);
        }
        if ((iVar9 - 0x13U | uVar13) < 2) {
          if (0 < iVar3) {
            iVar9 = 0;
            do {
              if (0 < (int)uVar2) {
                uVar13 = 0;
                do {
                  if (0 < (int)uVar1) {
                    uVar12 = 0;
                    do {
                      iVar10 = ConstPixelBufferAccess::getPixStencil
                                         ((ConstPixelBufferAccess *)src,uVar12,uVar13,iVar9);
                      PixelBufferAccess::setPixStencil
                                ((PixelBufferAccess *)dst,iVar10,uVar12,uVar13,iVar9);
                      uVar12 = uVar12 + 1;
                    } while (uVar1 != uVar12);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar2);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != iVar3);
          }
        }
        else {
          uVar11 = CONCAT31((int3)(uVar1 >> 8),1 < uVar13);
          if (iVar9 - 0x15U < 0xfffffffe && 1 >= uVar13) {
            clearStencil((PixelBufferAccess *)dst,0);
            return extraout_EAX;
          }
        }
      }
      else {
        TVar6 = getTextureChannelClass(channelType);
        TVar7 = getTextureChannelClass(channelType_00);
        if (((TVar6 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ==
             TEXTURECHANNELCLASS_SIGNED_INTEGER) &&
           ((TVar7 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ==
            TEXTURECHANNELCLASS_SIGNED_INTEGER)) {
          if (0 < iVar3) {
            iVar9 = 0;
            do {
              if (0 < (int)uVar2) {
                uVar13 = 0;
                do {
                  if (0 < (int)uVar1) {
                    uVar12 = 0;
                    do {
                      ConstPixelBufferAccess::getPixelInt
                                ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)src,uVar12,
                                 uVar13);
                      PixelBufferAccess::setPixel
                                ((PixelBufferAccess *)dst,(IVec4 *)&stack0xffffffffffffffc0,uVar12,
                                 uVar13,iVar9);
                      uVar12 = uVar12 + 1;
                    } while (uVar1 != uVar12);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar2);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != iVar3);
          }
        }
        else if (0 < iVar3) {
          iVar9 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar13 = 0;
              do {
                if (0 < (int)uVar1) {
                  uVar12 = 0;
                  do {
                    ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)src,uVar12,
                               uVar13);
                    PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)dst,(Vec4 *)&stack0xffffffffffffffc0,uVar12,
                               uVar13,iVar9);
                    uVar12 = uVar12 + 1;
                  } while (uVar1 != uVar12);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar2);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != iVar3);
        }
      }
    }
    else {
      uVar11 = uVar2;
      if (0 < iVar3) {
        iVar9 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar13 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar12 = 0;
                do {
                  memcpy((void *)((long)(*(int *)(dst + 0x1c) * iVar9) +
                                  (long)(int)(*(int *)(dst + 0x18) * uVar13) +
                                 (long)(int)(*(int *)(dst + 0x14) * uVar12) + *(long *)(dst + 0x20))
                         ,(void *)((long)(*(int *)(src + 0x1c) * iVar9) +
                                   (long)(int)(*(int *)(src + 0x18) * uVar13) +
                                  (long)(int)(*(int *)(src + 0x14) * uVar12) + *(long *)(src + 0x20)
                                  ),(long)iVar4);
                  uVar12 = uVar12 + 1;
                } while (uVar1 != uVar12);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar2);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != iVar3);
      }
    }
  }
  else {
    pvVar8 = (void *)(ulong)uVar1;
    if (0 < iVar3) {
      iVar9 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar11 = 0;
          do {
            pvVar8 = memcpy((void *)((long)(*(int *)(dst + 0x1c) * iVar9) +
                                    (long)(int)(*(int *)(dst + 0x18) * uVar11) +
                                    *(long *)(dst + 0x20)),
                            (void *)((long)(*(int *)(src + 0x1c) * iVar9) +
                                    (long)(int)(*(int *)(src + 0x18) * uVar11) +
                                    *(long *)(src + 0x20)),(long)(int)(iVar4 * uVar1));
            uVar11 = uVar11 + 1;
          } while (uVar2 != uVar11);
        }
        uVar11 = (uint)pvVar8;
        iVar9 = iVar9 + 1;
      } while (iVar9 != iVar3);
    }
  }
  return uVar11;
}

Assistant:

void copy (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src)
{
	DE_ASSERT(src.getSize() == dst.getSize());

	const int	width				= dst.getWidth();
	const int	height				= dst.getHeight();
	const int	depth				= dst.getDepth();

	const int	srcPixelSize		= src.getFormat().getPixelSize();
	const int	dstPixelSize		= dst.getFormat().getPixelSize();
	const int	srcPixelPitch		= src.getPixelPitch();
	const int	dstPixelPitch		= dst.getPixelPitch();
	const bool	srcTightlyPacked	= (srcPixelSize == srcPixelPitch);
	const bool	dstTightlyPacked	= (dstPixelSize == dstPixelPitch);

	const bool	srcHasDepth			= (src.getFormat().order == tcu::TextureFormat::DS || src.getFormat().order == tcu::TextureFormat::D);
	const bool	srcHasStencil		= (src.getFormat().order == tcu::TextureFormat::DS || src.getFormat().order == tcu::TextureFormat::S);
	const bool	dstHasDepth			= (dst.getFormat().order == tcu::TextureFormat::DS || dst.getFormat().order == tcu::TextureFormat::D);
	const bool	dstHasStencil		= (dst.getFormat().order == tcu::TextureFormat::DS || dst.getFormat().order == tcu::TextureFormat::S);

	if (src.getFormat() == dst.getFormat() && srcTightlyPacked && dstTightlyPacked)
	{
		// Fast-path for matching formats.
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
			deMemcpy(dst.getPixelPtr(0, y, z), src.getPixelPtr(0, y, z), srcPixelSize*width);
	}
	else if (src.getFormat() == dst.getFormat())
	{
		// Bit-exact copy for matching formats.
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
			deMemcpy(dst.getPixelPtr(x, y, z), src.getPixelPtr(x, y, z), srcPixelSize);
	}
	else if (srcHasDepth || srcHasStencil || dstHasDepth || dstHasStencil)
	{
		DE_ASSERT((srcHasDepth && dstHasDepth) || (srcHasStencil && dstHasStencil)); // must have at least one common channel

		if (dstHasDepth && srcHasDepth)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixDepth(src.getPixDepth(x, y, z), x, y, z);
		}
		else if (dstHasDepth && !srcHasDepth)
		{
			// consistency with color copies
			tcu::clearDepth(dst, 0.0f);
		}

		if (dstHasStencil && srcHasStencil)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixStencil(src.getPixStencil(x, y, z), x, y, z);
		}
		else if (dstHasStencil && !srcHasStencil)
		{
			// consistency with color copies
			tcu::clearStencil(dst, 0u);
		}
	}
	else
	{
		TextureChannelClass		srcClass	= getTextureChannelClass(src.getFormat().type);
		TextureChannelClass		dstClass	= getTextureChannelClass(dst.getFormat().type);
		bool					srcIsInt	= srcClass == TEXTURECHANNELCLASS_SIGNED_INTEGER || srcClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		bool					dstIsInt	= dstClass == TEXTURECHANNELCLASS_SIGNED_INTEGER || dstClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

		if (srcIsInt && dstIsInt)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixel(src.getPixelInt(x, y, z), x, y, z);
		}
		else
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixel(src.getPixel(x, y, z), x, y, z);
		}
	}
}